

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *old)

{
  long in_RSI;
  long in_RDI;
  
  MessageInfo::MessageInfo(&this->m_info,&old->m_info);
  *(undefined1 *)(in_RDI + 0x50) = 0;
  *(undefined1 *)(in_RSI + 0x50) = 1;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage&& old )
    : m_info( old.m_info ), m_moved()
    {
        old.m_moved = true;
    }